

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Btree_BtreeMultimapEmplaceHint_Test::
~Btree_BtreeMultimapEmplaceHint_Test(Btree_BtreeMultimapEmplaceHint_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, BtreeMultimapEmplaceHint) {
        const int key_to_insert = 123456;
        const char value0[] = "a";
        phmap::btree_multimap<int, std::string> s;
        auto iter = s.emplace(key_to_insert, value0);
        ASSERT_NE(iter, s.end());
        EXPECT_EQ(iter->first, key_to_insert);
        EXPECT_EQ(iter->second, value0);
        const char value1[] = "b";
        auto emplace_iter = s.emplace_hint(iter, key_to_insert, value1);
        EXPECT_NE(emplace_iter, iter);
        ASSERT_NE(emplace_iter, s.end());
        EXPECT_EQ(emplace_iter->first, key_to_insert);
        EXPECT_EQ(emplace_iter->second, value1);
    }